

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void dec_parse_sao_param(com_core_t *core,int lcu_idx,com_sao_param_t *sao_cur_param)

{
  com_lbac_t *lbac;
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  com_seqh_t *pcVar6;
  s8 *psVar7;
  com_sao_param_t (*pacVar8) [3];
  byte *pbVar9;
  byte *pbVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  sbyte sVar16;
  int bins;
  u32 uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  byte *pbVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  bool bVar32;
  bool bVar33;
  
  if ((((core->pathdr).slice_sao_enable[0] == '\0') && ((core->pathdr).slice_sao_enable[1] == '\0'))
     && ((core->pathdr).slice_sao_enable[2] == '\0')) {
    sao_cur_param->enable = 0;
    sao_cur_param[1].enable = 0;
    sao_cur_param[2].enable = 0;
    return;
  }
  pcVar6 = core->seqhdr;
  psVar7 = (core->map).map_patch;
  lVar25 = (long)lcu_idx;
  bVar33 = false;
  bVar32 = false;
  if (core->lcu_y != 0) {
    bVar32 = psVar7[lVar25] == psVar7[lVar25 - pcVar6->pic_width_in_lcu];
  }
  if (core->lcu_x != 0) {
    bVar33 = psVar7[lVar25] == psVar7[lVar25 + -1];
  }
  lbac = &core->lbac;
  if (bVar33 == false && bVar32 == false) goto LAB_00143808;
  if ((char)(bVar33 + bVar32) == '\x02') {
    uVar17 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_merge_flag + 1);
    if (uVar17 == 0) {
      uVar17 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_merge_flag + 2);
      uVar17 = uVar17 * 2;
      goto LAB_0014371b;
    }
    if ((bVar32 != false) && (uVar17 = 1, bVar33 == false)) goto LAB_00143743;
LAB_001437a9:
    pacVar8 = core->sao_param_map;
    lVar24 = -0x84;
    do {
      puVar2 = (undefined8 *)((long)pacVar8[lVar25][0].bandIdx + lVar24 + -8);
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      puVar2 = (undefined8 *)((long)pacVar8[lVar25][0].bandIdx + lVar24 + 8);
      uVar13 = *puVar2;
      uVar14 = puVar2[1];
      puVar2 = (undefined8 *)((long)pacVar8[lVar25][0].offset + lVar24 + 4);
      uVar15 = puVar2[1];
      puVar1 = (undefined8 *)((long)sao_cur_param[3].offset + lVar24 + 4);
      *puVar1 = *puVar2;
      puVar1[1] = uVar15;
      puVar2 = (undefined8 *)((long)sao_cur_param[3].bandIdx + lVar24 + 8);
      *puVar2 = uVar13;
      puVar2[1] = uVar14;
      puVar2 = (undefined8 *)((long)sao_cur_param[3].bandIdx + lVar24 + -8);
      *puVar2 = uVar11;
      puVar2[1] = uVar12;
      lVar24 = lVar24 + 0x2c;
    } while (lVar24 != 0);
  }
  else {
    if ((char)(bVar33 + bVar32) == '\x01') {
      uVar17 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_merge_flag);
LAB_0014371b:
      if ((bVar32 != false) || (bVar33 == false)) {
        if ((bVar32 != false) && (bVar33 == false)) goto LAB_00143743;
        if (uVar17 == 0) goto LAB_00143808;
        uVar22 = 3 - uVar17;
        goto LAB_0014374a;
      }
      if (uVar17 != 0) goto LAB_001437a9;
    }
    else {
      if (((bVar32 == false) && (bVar33 != false)) ||
         ((bVar32 == false || (uVar17 = 0, bVar33 != false)))) goto LAB_00143808;
LAB_00143743:
      uVar22 = (uint)(uVar17 != 0);
LAB_0014374a:
      if (uVar22 == 2) goto LAB_001437a9;
      if (uVar22 != 0) {
        lVar25 = lVar25 - pcVar6->pic_width_in_lcu;
        pacVar8 = core->sao_param_map;
        lVar24 = 0;
        do {
          puVar2 = (undefined8 *)((long)pacVar8[lVar25][0].bandIdx + lVar24 + -8);
          uVar11 = *puVar2;
          uVar12 = puVar2[1];
          puVar2 = (undefined8 *)((long)pacVar8[lVar25][0].bandIdx + lVar24 + 8);
          uVar13 = *puVar2;
          uVar14 = puVar2[1];
          puVar2 = (undefined8 *)((long)pacVar8[lVar25][0].offset + lVar24 + 4);
          uVar15 = puVar2[1];
          puVar1 = (undefined8 *)((long)sao_cur_param->offset + lVar24 + 4);
          *puVar1 = *puVar2;
          puVar1[1] = uVar15;
          puVar2 = (undefined8 *)((long)sao_cur_param->bandIdx + lVar24 + 8);
          *puVar2 = uVar13;
          puVar2[1] = uVar14;
          puVar2 = (undefined8 *)((long)sao_cur_param->bandIdx + lVar24 + -8);
          *puVar2 = uVar11;
          puVar2[1] = uVar12;
          lVar24 = lVar24 + 0x2c;
        } while (lVar24 != 0x84);
        return;
      }
    }
LAB_00143808:
    lVar25 = 0;
    do {
      if (((core->pathdr).slice_sao_enable[lVar25] == '\0') ||
         (uVar17 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_mode), uVar17 != 0)) {
        sao_cur_param[lVar25].enable = 0;
      }
      else {
        uVar17 = lbac_dec_bin_ep(lbac);
        sao_cur_param[lVar25].enable = 1;
        sao_cur_param[lVar25].type = (uint)(uVar17 != 0) << 2;
        sao_cur_param[lVar25].offset[2] = 0;
        uVar26 = 0;
        do {
          if (sao_cur_param[lVar25].type == 4) {
            uVar17 = lbac_dec_bin(lbac,(core->lbac).ctx.sao_offset);
            uVar20 = uVar26;
            uVar28 = uVar17 ^ 1;
            if (uVar17 == 0) {
              iVar18 = (core->lbac).range * 0x10000;
              uVar31 = 0;
              uVar22 = (core->lbac).low;
              do {
                iVar19 = 0;
                if (iVar18 < (int)uVar22) {
                  iVar19 = iVar18;
                }
                uVar28 = (uVar22 - iVar19) * 2;
                if ((uVar22 & 0x7fff) == 0) {
                  uVar21 = (int)(uVar28 - 1 ^ uVar28) >> 0xf;
                  iVar19 = 0x1f;
                  if (uVar21 != 0) {
                    for (; uVar21 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                    }
                  }
                  pbVar9 = (core->lbac).cur;
                  pbVar10 = (core->lbac).end;
                  bVar3 = *pbVar9;
                  bVar4 = pbVar9[1];
                  pbVar27 = pbVar9 + 2;
                  if (pbVar10 <= pbVar9 + 2) {
                    pbVar27 = pbVar10;
                  }
                  (core->lbac).cur = pbVar27;
                  uVar28 = ((uint)bVar3 * 0x200 + (uint)bVar4 * 2 + -0xffff <<
                           (0x1e - ((byte)iVar19 ^ 0x1f) & 0x1f)) + uVar28;
                }
                uVar31 = uVar31 + ((int)uVar22 <= iVar18);
              } while ((uVar31 < 6) && (bVar32 = (int)uVar22 <= iVar18, uVar22 = uVar28, bVar32));
              (core->lbac).low = uVar28;
              uVar31 = uVar31 + (uVar17 ^ 1);
              uVar17 = lbac_dec_bin_ep(lbac);
              uVar28 = -uVar31;
              if (uVar17 == 0) {
                uVar28 = uVar31;
              }
            }
          }
          else {
            uVar31 = ((int)uVar26 + 1) - (uint)(uVar26 < 2);
            uVar20 = (ulong)uVar31;
            cVar5 = dec_parse_sao_offset_saoclip[uVar20 * 3 + 2];
            iVar18 = (core->lbac).range * 0x10000;
            uVar28 = 0;
            uVar22 = (core->lbac).low;
            do {
              iVar19 = 0;
              if (iVar18 < (int)uVar22) {
                iVar19 = iVar18;
              }
              uVar21 = (uVar22 - iVar19) * 2;
              if ((uVar22 & 0x7fff) == 0) {
                uVar29 = (int)(uVar21 - 1 ^ uVar21) >> 0xf;
                iVar19 = 0x1f;
                if (uVar29 != 0) {
                  for (; uVar29 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                  }
                }
                pbVar9 = (core->lbac).cur;
                pbVar10 = (core->lbac).end;
                bVar3 = *pbVar9;
                bVar4 = pbVar9[1];
                pbVar27 = pbVar9 + 2;
                if (pbVar10 <= pbVar9 + 2) {
                  pbVar27 = pbVar10;
                }
                (core->lbac).cur = pbVar27;
                uVar21 = ((uint)bVar3 * 0x200 + -0xffff + (uint)bVar4 * 2 <<
                         (0x1e - ((byte)iVar19 ^ 0x1f) & 0x1f)) + uVar21;
              }
              uVar28 = uVar28 + ((int)uVar22 <= iVar18);
            } while ((uVar28 < (uint)(int)cVar5) &&
                    (bVar32 = (int)uVar22 <= iVar18, uVar22 = uVar21, bVar32));
            (core->lbac).low = uVar21;
            if (uVar20 == 4) {
              uVar20 = 4;
              uVar28 = -(int)*(char *)((long)&dec_parse_sao_offset_EO_OFFSET_INV__MAP +
                                      (long)(int)uVar28);
            }
            else if (uVar31 == 3) {
              uVar20 = 3;
              uVar28 = -uVar28;
            }
            else if (uVar31 == 0) {
              uVar20 = 0;
              uVar28 = (int)*(char *)((long)&dec_parse_sao_offset_EO_OFFSET_INV__MAP +
                                     (long)(int)uVar28);
            }
          }
          sao_cur_param[lVar25].offset[uVar20] = uVar28;
          uVar26 = uVar26 + 1;
        } while (uVar26 != 4);
        uVar22 = (core->lbac).low;
        iVar18 = (core->lbac).range * 0x10000;
        if (sao_cur_param[lVar25].type == 4) {
          iVar19 = 0;
          uVar28 = 0;
          do {
            bVar32 = iVar18 < (int)uVar22;
            iVar30 = 0;
            if (iVar18 < (int)uVar22) {
              iVar30 = iVar18;
            }
            uVar21 = (uVar22 - iVar30) * 2;
            uVar31 = uVar22 & 0x7fff;
            uVar22 = uVar21;
            if (uVar31 == 0) {
              uVar22 = (int)(uVar21 - 1 ^ uVar21) >> 0xf;
              iVar30 = 0x1f;
              if (uVar22 != 0) {
                for (; uVar22 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                }
              }
              pbVar9 = (core->lbac).cur;
              pbVar10 = (core->lbac).end;
              bVar3 = *pbVar9;
              bVar4 = pbVar9[1];
              pbVar27 = pbVar9 + 2;
              if (pbVar10 <= pbVar9 + 2) {
                pbVar27 = pbVar10;
              }
              (core->lbac).cur = pbVar27;
              uVar22 = ((uint)bVar3 * 0x200 + (uint)bVar4 * 2 + -0xffff <<
                       (0x1e - ((byte)iVar30 ^ 0x1f) & 0x1f)) + uVar21;
            }
            uVar28 = uVar28 | (uint)bVar32 << ((byte)iVar19 & 0x1f);
            iVar19 = iVar19 + 1;
          } while (iVar19 != 5);
          (core->lbac).low = uVar22;
          uVar31 = 0;
          do {
            uVar21 = uVar31;
            bVar32 = iVar18 < (int)uVar22;
            bVar33 = (int)uVar22 <= iVar18;
            iVar19 = 0;
            if (iVar18 < (int)uVar22) {
              iVar19 = iVar18;
            }
            uVar29 = (uVar22 - iVar19) * 2;
            uVar31 = uVar22 & 0x7fff;
            uVar22 = uVar29;
            if (uVar31 == 0) {
              uVar22 = (int)(uVar29 - 1 ^ uVar29) >> 0xf;
              iVar19 = 0x1f;
              if (uVar22 != 0) {
                for (; uVar22 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                }
              }
              pbVar9 = (core->lbac).cur;
              pbVar10 = (core->lbac).end;
              bVar3 = *pbVar9;
              bVar4 = pbVar9[1];
              pbVar27 = pbVar9 + 2;
              if (pbVar10 <= pbVar9 + 2) {
                pbVar27 = pbVar10;
              }
              (core->lbac).cur = pbVar27;
              uVar22 = ((uint)bVar3 * 0x200 + (uint)bVar4 * 2 + -0xffff <<
                       (0x1e - ((byte)iVar19 ^ 0x1f) & 0x1f)) + uVar29;
            }
            uVar31 = bVar33 + uVar21;
          } while ((bool)(~bVar32 & uVar31 < 3));
          (core->lbac).low = uVar22;
          iVar19 = (uint)(uVar31 < 3) * 4 + -3;
          if (iVar19 + uVar31 == 0 || SCARRY4(iVar19,uVar31) != (int)(iVar19 + uVar31) < 0) {
            iVar19 = 0;
          }
          else {
            uVar29 = ((byte)(bVar32 + 1) & 1) + iVar19 + uVar21 + 1;
            iVar19 = 0;
            uVar21 = uVar22;
            do {
              iVar30 = 0;
              if (iVar18 < (int)uVar21) {
                iVar30 = iVar18;
              }
              uVar22 = (uVar21 - iVar30) * 2;
              if ((uVar21 & 0x7fff) == 0) {
                uVar23 = (int)(uVar22 - 1 ^ uVar22) >> 0xf;
                iVar30 = 0x1f;
                if (uVar23 != 0) {
                  for (; uVar23 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                  }
                }
                pbVar9 = (core->lbac).cur;
                pbVar10 = (core->lbac).end;
                bVar3 = *pbVar9;
                bVar4 = pbVar9[1];
                pbVar27 = pbVar9 + 2;
                if (pbVar10 <= pbVar9 + 2) {
                  pbVar27 = pbVar10;
                }
                (core->lbac).cur = pbVar27;
                uVar22 = ((uint)bVar3 * 0x200 + (uint)bVar4 * 2 + -0xffff <<
                         (0x1e - ((byte)iVar30 ^ 0x1f) & 0x1f)) + uVar22;
              }
              iVar19 = (uint)(iVar18 < (int)uVar21) + iVar19 * 2;
              uVar29 = uVar29 - 1;
              uVar21 = uVar22;
            } while (1 < uVar29);
          }
          (core->lbac).low = uVar22;
          sao_cur_param[lVar25].bandIdx[0] = uVar28;
          uVar22 = uVar28 + 0x20;
          if (-1 < (int)(uVar28 + 1)) {
            uVar22 = uVar28 + 1;
          }
          sao_cur_param[lVar25].bandIdx[1] = (uVar28 - (uVar22 & 0xffffffe0)) + 1;
          iVar18 = (2 << ((byte)uVar31 & 0x1f)) + uVar28;
          uVar28 = iVar19 + iVar18 + 1;
          uVar31 = iVar18 + iVar19;
          uVar22 = iVar19 + iVar18 + 0x1f;
          if (-1 < (int)uVar31) {
            uVar22 = uVar31;
          }
          uVar21 = iVar19 + iVar18 + 0x20;
          if (-1 < (int)uVar28) {
            uVar21 = uVar28;
          }
          sao_cur_param[lVar25].bandIdx[2] = uVar31 - (uVar22 & 0xffffffe0);
          sao_cur_param[lVar25].bandIdx[3] = uVar28 - (uVar21 & 0xffffffe0);
        }
        else {
          sVar16 = 0;
          uVar28 = 0;
          bVar32 = true;
          do {
            bVar33 = bVar32;
            bVar32 = iVar18 < (int)uVar22;
            iVar19 = 0;
            if (iVar18 < (int)uVar22) {
              iVar19 = iVar18;
            }
            uVar21 = (uVar22 - iVar19) * 2;
            uVar31 = uVar22 & 0x7fff;
            uVar22 = uVar21;
            if (uVar31 == 0) {
              uVar22 = (int)(uVar21 - 1 ^ uVar21) >> 0xf;
              iVar19 = 0x1f;
              if (uVar22 != 0) {
                for (; uVar22 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                }
              }
              pbVar9 = (core->lbac).cur;
              pbVar10 = (core->lbac).end;
              bVar3 = *pbVar9;
              bVar4 = pbVar9[1];
              pbVar27 = pbVar9 + 2;
              if (pbVar10 <= pbVar9 + 2) {
                pbVar27 = pbVar10;
              }
              (core->lbac).cur = pbVar27;
              uVar22 = ((uint)bVar3 * 0x200 + (uint)bVar4 * 2 + -0xffff <<
                       (0x1e - ((byte)iVar19 ^ 0x1f) & 0x1f)) + uVar21;
            }
            uVar28 = uVar28 | (uint)bVar32 << sVar16;
            sVar16 = 1;
            bVar32 = false;
          } while (bVar33);
          (core->lbac).low = uVar22;
          sao_cur_param[lVar25].type = uVar28;
        }
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != 3);
  }
  return;
}

Assistant:

void dec_parse_sao_param(com_core_t* core, int lcu_idx, com_sao_param_t *sao_cur_param)
{
    com_patch_header_t *sh = &core->pathdr;

    if (!sh->slice_sao_enable[Y_C] && !sh->slice_sao_enable[U_C] && !sh->slice_sao_enable[V_C]) {
        sao_cur_param[0].enable = 0;
        sao_cur_param[1].enable = 0;
        sao_cur_param[2].enable = 0;
    } else {
        com_seqh_t *seqhdr = core->seqhdr;
        com_lbac_t *lbac = &core->lbac;
        int cur_patch = core->map.map_patch[lcu_idx];
        int MergeUpAvail   = (core->lcu_y == 0) ? 0 : cur_patch == core->map.map_patch[lcu_idx - seqhdr->pic_width_in_lcu];
        int MergeLeftAvail = (core->lcu_x == 0) ? 0 : cur_patch == core->map.map_patch[lcu_idx -                      1];
        int mergemode = 0;

        if (MergeLeftAvail + MergeUpAvail > 0) {
            mergemode = dec_parse_sao_mergeflag(lbac, MergeLeftAvail, MergeUpAvail);
        }
        if (mergemode) {
            if (mergemode == 2) {
                copy_sao_param(sao_cur_param, core->sao_param_map[lcu_idx - 1]);
            } else {
                copy_sao_param(sao_cur_param, core->sao_param_map[lcu_idx - seqhdr->pic_width_in_lcu]);
            }
        } else {
            int compIdx;

            for (compIdx = Y_C; compIdx < N_C; compIdx++) {
                if (!sh->slice_sao_enable[compIdx]) {
                    sao_cur_param[compIdx].enable = 0;
                } else {
                    switch (dec_parse_sao_mode(lbac)) {
                    case 0:
                        sao_cur_param[compIdx].enable = 0;
                        break;
                    case 1:
                        sao_cur_param[compIdx].enable = 1;
                        sao_cur_param[compIdx].type = SAO_TYPE_BO;
                        break;
                    case 2:
                        sao_cur_param[compIdx].enable = 1;
                        sao_cur_param[compIdx].type = SAO_TYPE_EO_0;
                        break;
                    default:
                        uavs3d_assert(0);
                        break;
                    }

                    if (sao_cur_param[compIdx].enable) {
                        dec_parse_sao_offset(lbac, &(sao_cur_param[compIdx]), sao_cur_param[compIdx].offset);

                        if (sao_cur_param[compIdx].type == SAO_TYPE_BO) {
                            dec_parse_sao_bo_start(lbac, &(sao_cur_param[compIdx]), sao_cur_param[compIdx].bandIdx);
                        } else {
                            sao_cur_param[compIdx].type = dec_parse_sao_eo_type(lbac, &(sao_cur_param[compIdx]));
                        }
                    }
                }
            }
        }
    }
}